

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

float lodepng::lodepng_powf(float x,float y)

{
  float in_XMM0_Da;
  float in_XMM1_Da;
  int i;
  float t1;
  float t0;
  float j;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  uint local_1c;
  float in_stack_ffffffffffffffec;
  float in_stack_fffffffffffffff0;
  float fVar1;
  float local_8;
  float local_4;
  
  local_1c = 0;
  if (((in_XMM0_Da == 1.0) && (!NAN(in_XMM0_Da))) || ((in_XMM1_Da == 0.0 && (!NAN(in_XMM1_Da))))) {
    return 1.0;
  }
  local_8 = in_XMM0_Da;
  if ((((in_XMM0_Da <= 0.0) || (3.4028235e+38 < in_XMM0_Da)) || (3.4028235e+38 < in_XMM1_Da)) ||
     (in_XMM1_Da < -3.4028235e+38)) {
    if ((in_XMM1_Da == 1.0) && (!NAN(in_XMM1_Da))) {
      return in_XMM0_Da;
    }
    if ((NAN(in_XMM0_Da)) || (NAN(in_XMM1_Da))) {
      return in_XMM0_Da + in_XMM1_Da;
    }
    if (in_XMM0_Da <= 0.0) {
      if ((-1.0737418e+09 <= in_XMM1_Da) && (in_XMM1_Da <= 1.0737418e+09)) {
        local_1c = (uint)in_XMM1_Da;
        if (((float)(int)local_1c != in_XMM1_Da) || (NAN((float)(int)local_1c) || NAN(in_XMM1_Da)))
        {
          if (-3.4028235e+38 <= in_XMM0_Da) {
            if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
              local_30 = lodepng_flt_nan;
            }
            else {
              if (0.0 <= in_XMM1_Da) {
                local_2c = 0.0;
              }
              else {
                local_2c = lodepng_flt_inf;
              }
              local_30 = local_2c;
            }
            local_28 = local_30;
          }
          else {
            if (0.0 <= in_XMM1_Da) {
              local_24 = lodepng_flt_inf;
            }
            else {
              local_24 = 0.0;
            }
            local_28 = local_24;
          }
          return local_28;
        }
        if ((local_1c & 1) != 0) {
          if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
            local_38 = lodepng_powf(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
            local_38 = -local_38;
          }
          else {
            local_34 = in_XMM0_Da;
            if (in_XMM1_Da < 0.0) {
              local_34 = 1.0 / in_XMM0_Da;
            }
            local_38 = local_34;
          }
          return local_38;
        }
      }
      if ((in_XMM0_Da == 0.0) && (!NAN(in_XMM0_Da))) {
        if (0.0 < in_XMM1_Da) {
          local_3c = 0.0;
        }
        else {
          local_3c = lodepng_flt_inf;
        }
        return local_3c;
      }
      if (in_XMM0_Da < -3.4028235e+38) {
        if (0.0 < in_XMM1_Da) {
          if ((local_1c & 1) == 0) {
            local_44 = lodepng_flt_inf;
          }
          else {
            local_44 = -lodepng_flt_inf;
          }
          local_40 = local_44;
        }
        else {
          local_40 = (float)(in_XMM1_Da == 0.0);
        }
        return local_40;
      }
      local_8 = -in_XMM0_Da;
      if ((local_8 == 1.0) && (!NAN(local_8))) {
        return 1.0;
      }
    }
    else if (3.4028235e+38 < in_XMM0_Da) {
      local_20 = in_XMM0_Da;
      if (in_XMM1_Da <= 0.0) {
        local_20 = (float)(in_XMM1_Da == 0.0);
      }
      return local_20;
    }
    if ((in_XMM1_Da < -3.4028235e+38) || (3.4028235e+38 < in_XMM1_Da)) {
      if (local_8 < 1.0 == 0.0 < in_XMM1_Da) {
        local_4c = 0.0;
      }
      else {
        local_48 = in_XMM1_Da;
        if (in_XMM1_Da < 0.0) {
          local_48 = -in_XMM1_Da;
        }
        local_4c = local_48;
      }
      return local_4c;
    }
  }
  fVar1 = 0.0;
  for (; local_8 < 1.5258789e-05; local_8 = local_8 * 65536.0) {
    fVar1 = fVar1 - 16.0;
  }
  for (; 65536.0 < local_8; local_8 = local_8 * 1.5258789e-05) {
    fVar1 = fVar1 + 16.0;
  }
  for (; local_8 < 1.0; local_8 = local_8 * 2.0) {
    fVar1 = fVar1 + -1.0;
  }
  for (; 2.0 < local_8; local_8 = local_8 * 0.5) {
    fVar1 = fVar1 + 1.0;
  }
  fVar1 = in_XMM1_Da *
          ((local_8 * (local_8 * (local_8 * 0.015339733 + 0.46614265) + -0.088363945) + -0.3931184)
           / (local_8 * (local_8 * 0.13722828 + 0.38889202) + 0.09074479) + fVar1);
  if ((fVar1 <= -128.0) || (128.0 <= fVar1)) {
    if (fVar1 <= 0.0) {
      local_50 = 0.0;
    }
    else {
      local_50 = lodepng_flt_inf;
    }
    local_4 = local_50;
  }
  else {
    local_1c = (uint)fVar1;
    fVar1 = fVar1 - (float)(int)local_1c;
    local_54 = fVar1 * (fVar1 * (fVar1 * 0.0056350236 + 0.07284826) + 0.41777834) + 1.0;
    fVar1 = fVar1 * (fVar1 * 0.023501446 + -0.27537015) + 1.0;
    for (; (int)local_1c < -0x1e; local_1c = local_1c + 0x1f) {
      local_54 = local_54 * 4.656613e-10;
    }
    for (; 0x1e < (int)local_1c; local_1c = local_1c + -0x1f) {
      local_54 = local_54 * 2.1474836e+09;
    }
    if ((int)local_1c < 0) {
      local_54 = local_54 / (fVar1 * (float)(1 << (-(byte)local_1c & 0x1f)));
    }
    else {
      local_54 = (local_54 * (float)(1 << ((byte)local_1c & 0x1f))) / fVar1;
    }
    local_4 = local_54;
  }
  return local_4;
}

Assistant:

static float lodepng_powf(float x, float y) {
  float j, t0, t1;
  int i = 0;
  /* handle all the special floating point rules */
  if(x == 1 || y == 0) return 1;
  if(!(x > 0 && x <= lodepng_flt_max && y == y && y <= lodepng_flt_max && y >= -lodepng_flt_max)) {
    if(y == 1) return x; /* preserves negative-0 */
    if(x != x || y != y) return x + y; /* nan */
    if(x > 0) {
      if(x > lodepng_flt_max) return y <= 0 ? (y == 0 ? 1 : 0) : x; /* x = +infinity */
    } else {
      if(!(y < -1073741824.0f || y > 1073741824.0f)) { /* large y always even integer, but cast would overflow */
        i = (int)y;
        if(i != y) {
          return (x < -lodepng_flt_max) ? (y < 0 ? 0 : lodepng_flt_inf) :
              (x == 0 ? (y < 0 ? lodepng_flt_inf : 0) : lodepng_flt_nan);
        }
        if(i & 1) return x == 0 ? (y < 0 ? (1 / x) : x) : -lodepng_powf(-x, y);
      }
      if(x == 0) return y <= 0 ? lodepng_flt_inf : 0;
      if(x < -lodepng_flt_max) { /* x == -infinity */
        return y <= 0 ? (y == 0 ? 1 : 0) : ((i & 1) ?
            -lodepng_flt_inf : lodepng_flt_inf);
      }
      x = -x;
      if(x == 1) return 1;
    }
    if(y < -lodepng_flt_max || y > lodepng_flt_max) return ((x < 1) != (y > 0)) ? (y < 0 ? -y : y) : 0;
  }

  j = 0;
  while(x < (1.0f / 65536)) { j -= 16; x *= 65536.0f; }
  while(x > 65536) { j += 16; x *= (1.0f / 65536); }
  while(x < 1) { j--; x *= 2.0f; }
  while(x > 2) { j++; x *= 0.5f; }
  /* polynomial to approximate log2(x) with x in range 1..2 */
  t0 = -0.393118410458557f + x * (-0.0883639468229365f + x * (0.466142650227994f + x * 0.0153397331014276f));
  t1 = 0.0907447971403586f + x * (0.388892024755479f + x * 0.137228280305862f);
  x = t0 / t1 + j;

  x *= y; /* using the formula exp2(y * log2(x)) */

  if(!(x > -128.0f && x < 128.0f)) return x > 0 ? lodepng_flt_inf : 0; /* prevent int overflow */
  i = (int)x;
  x -= i;
  /* polynomial to approximate exp2(x) with x in range -1..1 */
  t0 = 1.0f + x * (0.41777833582744256f + x * (0.0728482595347711f + x * 0.005635023478609625f));
  t1 = 1.0f + x * (-0.27537016151408167f + x * 0.023501446055084033f);
  while(i <= -31) { t0 *= (1.0f / 2147483648.0f); i += 31; }
  while(i >= 31) { t0 *= 2147483648.0f; i -= 31; }
  return (i < 0) ? (t0 / (t1 * (1 << -i))) : ((t0 * (1 << i)) / t1);
}